

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

QChar * __thiscall
QStringConverterICU::toUtf16(QStringConverterICU *this,QChar *out,QByteArrayView in,State *state)

{
  void *pvVar1;
  int iVar2;
  State *state_00;
  long in_FS_OFFSET;
  void *context;
  UConverterToUCallback action;
  UChar_conflict *target;
  const_pointer source;
  UErrorCode err;
  State *local_60;
  undefined1 *local_58;
  QStringConverterICU *local_50;
  long local_48;
  undefined4 local_3c;
  long local_38;
  
  state_00 = (State *)in.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ensureConverter(state_00);
  pvVar1 = (state_00->field_4).d[0];
  local_3c = 0;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = (State *)&DAT_aaaaaaaaaaaaaaaa;
  local_50 = this;
  local_48 = in.m_size;
  ucnv_getToUCallBack_70(pvVar1,&local_58,&local_60);
  if (local_60 != state_00) {
    ucnv_setToUCallBack_70(pvVar1,local_58,state_00,0,0,&local_3c);
  }
  ucnv_toUnicode_70(pvVar1,&local_50,(long)&(this->super_QStringConverter).iface + (long)out * 4,
                    &local_48,(long)&out->ucs + in.m_size,0,0,&local_3c);
  if (((state_00->flags).super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
       super_QFlagsStorage<QStringConverterBase::Flag>.i & 1) != 0) {
    iVar2 = ucnv_toUCountPending_70(pvVar1,&local_3c);
    if (iVar2 != 0) {
      ucnv_reset_70(pvVar1);
      state_00->invalidChars = state_00->invalidChars + (long)iVar2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QChar *)local_50;
  }
  __stack_chk_fail();
}

Assistant:

static QChar *toUtf16(QChar *out, QByteArrayView in, QStringConverter::State *state)
    {
        QT_COM_THREAD_INIT
        ensureConverter(state);

        auto icu_conv = static_cast<UConverter *>(state->d[0]);
        UErrorCode err = U_ZERO_ERROR;
        auto source = in.data();
        auto sourceLimit = in.data() + in.size();

        qsizetype length = toLen(in.size());

        UChar *target = reinterpret_cast<UChar *>(out);
        auto targetLimit = target + length;
        // We explicitly clean up anyway, so no need to set flush to true,
        // which would just reset the converter.
        UBool flush = false;

        // If the QStringConverter was moved, the state that we used as a context is stale now.
        UConverterToUCallback action;
        const void *context;
        ucnv_getToUCallBack(icu_conv, &action, &context);
        if (context != state)
             ucnv_setToUCallBack(icu_conv, action, state, nullptr, nullptr, &err);

        ucnv_toUnicode(icu_conv, &target, targetLimit, &source, sourceLimit, nullptr, flush, &err);
        // We did reserve enough space:
        Q_ASSERT(err != U_BUFFER_OVERFLOW_ERROR);
        if (state->flags.testFlag(QStringConverter::Flag::Stateless)) {
            if (auto leftOver = ucnv_toUCountPending(icu_conv, &err)) {
                ucnv_reset(icu_conv);
                state->invalidChars += leftOver;
            }
        }
        return reinterpret_cast<QChar *>(target);
    }